

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers_iforest.hpp
# Opt level: O2

void calc_var_all_cols<InputData<float,int>,WorkerMemory<ImputedData<int,double>,double,float>,double>
               (InputData<float,_int> *input_data,
               WorkerMemory<ImputedData<int,_double>,_double,_float> *workspace,
               ModelParams *model_params,double *variances,double *saved_xmin,double *saved_xmax,
               double *saved_means,double *saved_sds)

{
  ColumnSampler<double> *this;
  size_t *col;
  size_t sVar1;
  int *Xc_indptr;
  pointer pdVar2;
  size_t *psVar3;
  ulong uVar4;
  vector<double,_std::allocator<double>_> *pvVar5;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar6;
  bool bVar7;
  double *buffer_cnt;
  long lVar8;
  int iVar9;
  pointer pdVar10;
  pointer buffer_cnt_00;
  long lVar11;
  double dVar12;
  double xsd;
  ModelParams *local_78;
  double xmean;
  robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
  *local_68;
  vector<double,_std::allocator<double>_> *local_60;
  double *local_58;
  double *local_50;
  vector<double,_std::allocator<double>_> *local_48;
  double *local_40;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_38;
  
  if (saved_means != (double *)0x0) {
    workspace->has_saved_stats = true;
  }
  this = &workspace->col_sampler;
  local_78 = model_params;
  local_58 = saved_xmin;
  local_50 = variances;
  local_40 = saved_xmax;
  ColumnSampler<double>::prepare_full_pass(this);
  col = &workspace->col_chosen;
  local_60 = &workspace->weights_arr;
  local_48 = &workspace->buffer_dbl;
  local_38 = &workspace->buffer_szt;
  local_68 = &workspace->weights_map;
  do {
    while( true ) {
      bVar7 = ColumnSampler<double>::sample_col(this,col);
      pvVar6 = local_38;
      pvVar5 = local_48;
      if (!bVar7) {
        return;
      }
      lVar11 = *col - input_data->ncols_numeric;
      if (*col < input_data->ncols_numeric) break;
      if ((workspace->weights_arr).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start ==
          (workspace->weights_arr).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        iVar9 = input_data->ncat[lVar11];
        lVar8 = (long)iVar9;
        uVar4 = lVar8 * 2;
        if ((workspace->weights_map).m_ht.m_nb_elements == 0) {
          buffer_cnt_00 =
               (workspace->buffer_szt).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
          if ((ulong)((long)(workspace->buffer_szt).
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)buffer_cnt_00 >> 3) <=
              uVar4) {
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(local_38,uVar4 | 1);
            iVar9 = input_data->ncat[lVar11];
            buffer_cnt_00 =
                 (pvVar6->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                 .super__Vector_impl_data._M_start;
            lVar8 = (long)iVar9;
          }
          xsd = expected_sd_cat<unsigned_long,double>
                          ((workspace->ix_arr).
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start,workspace->st,workspace->end,
                           input_data->categ_data + lVar11 * input_data->nrows,iVar9,
                           local_78->missing_action,buffer_cnt_00,buffer_cnt_00 + lVar8 + 1,
                           (workspace->buffer_dbl).
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start);
        }
        else {
          pdVar10 = (workspace->buffer_dbl).super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          if ((ulong)((long)(workspace->buffer_dbl).
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)pdVar10 >> 3) <= uVar4) {
            std::vector<double,_std::allocator<double>_>::resize(local_48,uVar4 | 1);
            iVar9 = input_data->ncat[lVar11];
            pdVar10 = (pvVar5->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data._M_start;
            lVar8 = (long)iVar9;
          }
          xsd = expected_sd_cat_weighted<tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>,unsigned_long,double>
                          ((workspace->ix_arr).
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start,workspace->st,workspace->end,
                           input_data->categ_data + lVar11 * input_data->nrows,iVar9,
                           local_78->missing_action,local_68,pdVar10,
                           (workspace->buffer_szt).
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start,pdVar10 + lVar8 + 1);
        }
      }
      else {
        buffer_cnt = (workspace->buffer_dbl).super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start;
        iVar9 = input_data->ncat[lVar11];
        lVar8 = (long)iVar9;
        if ((ulong)((long)(workspace->buffer_dbl).
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)buffer_cnt >> 3) <=
            (ulong)(lVar8 * 2)) {
          std::vector<double,_std::allocator<double>_>::resize(local_48,lVar8 * 2 | 1);
          iVar9 = input_data->ncat[lVar11];
          buffer_cnt = (pvVar5->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_start;
          lVar8 = (long)iVar9;
        }
        xsd = expected_sd_cat_weighted<std::vector<double,std::allocator<double>>,unsigned_long,double>
                        ((workspace->ix_arr).
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start,workspace->st,workspace->end,
                         input_data->categ_data + lVar11 * input_data->nrows,iVar9,
                         local_78->missing_action,local_60,buffer_cnt,
                         (workspace->buffer_szt).
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start,buffer_cnt + lVar8 + 1);
      }
LAB_00240235:
      if ((xsd != 0.0) || (NAN(xsd))) {
        dVar12 = xsd * xsd;
        sVar1 = workspace->col_chosen;
        if (workspace->tree_kurtoses == (double *)0x0) {
          if (input_data->col_weights != (float *)0x0) {
            dVar12 = dVar12 * (double)input_data->col_weights[sVar1];
          }
        }
        else {
          dVar12 = dVar12 * workspace->tree_kurtoses[sVar1];
        }
        if (dVar12 <= 1e-100) {
          dVar12 = 1e-100;
        }
        local_50[sVar1] = dVar12;
      }
      else {
        ColumnSampler<double>::drop_col(this,*col);
        local_50[*col] = 0.0;
      }
    }
    get_split_range<InputData<float,int>,WorkerMemory<ImputedData<int,double>,double,float>>
              (workspace,input_data,local_78);
    if (workspace->unsplittable != true) {
      if (local_58 != (double *)0x0) {
        sVar1 = workspace->col_chosen;
        local_58[sVar1] = workspace->xmin;
        local_40[sVar1] = workspace->xmax;
      }
      Xc_indptr = input_data->Xc_indptr;
      pdVar10 = (workspace->weights_arr).super__Vector_base<double,_std::allocator<double>_>._M_impl
                .super__Vector_impl_data._M_start;
      pdVar2 = (workspace->weights_arr).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (Xc_indptr == (int *)0x0) {
        if (pdVar10 == pdVar2) {
          psVar3 = (workspace->ix_arr).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if ((workspace->weights_map).m_ht.m_nb_elements == 0) {
            calc_mean_and_sd<float,double>
                      (psVar3,workspace->st,workspace->end,
                       input_data->numeric_data + input_data->nrows * workspace->col_chosen,
                       local_78->missing_action,&xsd,&xmean);
          }
          else {
            calc_mean_and_sd_weighted<float,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>,double>
                      (psVar3,workspace->st,workspace->end,
                       input_data->numeric_data + input_data->nrows * workspace->col_chosen,local_68
                       ,local_78->missing_action,&xsd,&xmean);
          }
        }
        else {
          calc_mean_and_sd_weighted<float,std::vector<double,std::allocator<double>>,double>
                    ((workspace->ix_arr).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start,workspace->st,workspace->end,
                     input_data->numeric_data + input_data->nrows * workspace->col_chosen,local_60,
                     local_78->missing_action,&xsd,&xmean);
        }
      }
      else if (pdVar10 == pdVar2) {
        psVar3 = (workspace->ix_arr).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if ((workspace->weights_map).m_ht.m_nb_elements == 0) {
          calc_mean_and_sd<float,int,double>
                    (psVar3,workspace->st,workspace->end,workspace->col_chosen,input_data->Xc,
                     input_data->Xc_ind,Xc_indptr,&xsd,&xmean);
        }
        else {
          calc_mean_and_sd_weighted<float,int,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>,double>
                    (psVar3,workspace->st,workspace->end,workspace->col_chosen,input_data->Xc,
                     input_data->Xc_ind,Xc_indptr,&xsd,&xmean,local_68);
        }
      }
      else {
        calc_mean_and_sd_weighted<float,int,std::vector<double,std::allocator<double>>,double>
                  ((workspace->ix_arr).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start,workspace->st,workspace->end,
                   workspace->col_chosen,input_data->Xc,input_data->Xc_ind,Xc_indptr,&xsd,&xmean,
                   local_60);
      }
      if (saved_means != (double *)0x0) {
        saved_means[*col] = xmean;
      }
      if (saved_sds != (double *)0x0) {
        saved_sds[*col] = xsd;
      }
      goto LAB_00240235;
    }
    ColumnSampler<double>::drop_col(this,*col);
    sVar1 = *col;
    local_50[sVar1] = 0.0;
    if (local_58 != (double *)0x0) {
      local_58[sVar1] = 0.0;
      local_40[sVar1] = 0.0;
    }
  } while( true );
}

Assistant:

void calc_var_all_cols(InputData &input_data, WorkerMemory &workspace, ModelParams &model_params,
                       double *restrict variances, double *restrict saved_xmin, double *restrict saved_xmax,
                       double *restrict saved_means, double *restrict saved_sds)
{
    double xmean, xsd;
    if (saved_means != NULL)
        workspace.has_saved_stats = true;

    workspace.col_sampler.prepare_full_pass();
    while (workspace.col_sampler.sample_col(workspace.col_chosen))
    {
        if (workspace.col_chosen < input_data.ncols_numeric)
        {
            get_split_range(workspace, input_data, model_params);
            if (workspace.unsplittable)
            {
                workspace.col_sampler.drop_col(workspace.col_chosen);
                variances[workspace.col_chosen] = 0;
                if (saved_xmin != NULL)
                {
                    saved_xmin[workspace.col_chosen] = 0;
                    saved_xmax[workspace.col_chosen] = 0;
                }
                continue;
            }

            if (saved_xmin != NULL)
            {
                saved_xmin[workspace.col_chosen] = workspace.xmin;
                saved_xmax[workspace.col_chosen] = workspace.xmax;
            }


            if (input_data.Xc_indptr == NULL)
            {
                if (workspace.weights_arr.empty() && workspace.weights_map.empty())
                {
                    calc_mean_and_sd<typename std::remove_pointer<decltype(input_data.numeric_data)>::type, ldouble_safe>(
                                     workspace.ix_arr.data(), workspace.st, workspace.end,
                                     input_data.numeric_data + workspace.col_chosen * input_data.nrows,
                                     model_params.missing_action, xsd, xmean);
                }

                else if (!workspace.weights_arr.empty())
                {
                    calc_mean_and_sd_weighted<typename std::remove_pointer<decltype(input_data.numeric_data)>::type,
                                              decltype(workspace.weights_arr), ldouble_safe>(
                                              workspace.ix_arr.data(), workspace.st, workspace.end,
                                              input_data.numeric_data + workspace.col_chosen * input_data.nrows,
                                              workspace.weights_arr,
                                              model_params.missing_action, xsd, xmean);
                }

                else
                {
                    calc_mean_and_sd_weighted<typename std::remove_pointer<decltype(input_data.numeric_data)>::type,
                                              decltype(workspace.weights_map), ldouble_safe>(
                                              workspace.ix_arr.data(), workspace.st, workspace.end,
                                              input_data.numeric_data + workspace.col_chosen * input_data.nrows,
                                              workspace.weights_map,
                                              model_params.missing_action, xsd, xmean);
                }
            }

            else
            {
                if (workspace.weights_arr.empty() && workspace.weights_map.empty())
                {
                    calc_mean_and_sd<typename std::remove_pointer<decltype(input_data.Xc)>::type,
                                     typename std::remove_pointer<decltype(input_data.Xc_indptr)>::type,
                                     ldouble_safe>(
                                     workspace.ix_arr.data(), workspace.st, workspace.end,
                                     workspace.col_chosen,
                                     input_data.Xc, input_data.Xc_ind, input_data.Xc_indptr,
                                     xsd, xmean);
                }

                else if (!workspace.weights_arr.empty())
                {
                    calc_mean_and_sd_weighted<typename std::remove_pointer<decltype(input_data.Xc)>::type,
                                              typename std::remove_pointer<decltype(input_data.Xc_indptr)>::type,
                                              decltype(workspace.weights_arr), ldouble_safe>(
                                              workspace.ix_arr.data(), workspace.st, workspace.end,
                                              workspace.col_chosen,
                                              input_data.Xc, input_data.Xc_ind, input_data.Xc_indptr,
                                              xsd, xmean, workspace.weights_arr);
                }

                else
                {
                    calc_mean_and_sd_weighted<typename std::remove_pointer<decltype(input_data.Xc)>::type,
                                              typename std::remove_pointer<decltype(input_data.Xc_indptr)>::type,
                                              decltype(workspace.weights_map), ldouble_safe>(
                                              workspace.ix_arr.data(), workspace.st, workspace.end,
                                              workspace.col_chosen,
                                              input_data.Xc, input_data.Xc_ind, input_data.Xc_indptr,
                                              xsd, xmean, workspace.weights_map);
                }
            }

            if (saved_means != NULL) saved_means[workspace.col_chosen] = xmean;
            if (saved_sds != NULL) saved_sds[workspace.col_chosen] = xsd;
        }

        else
        {
            size_t col = workspace.col_chosen - input_data.ncols_numeric;
            if (workspace.weights_arr.empty() && workspace.weights_map.empty())
            {
                if (workspace.buffer_szt.size() < (size_t)2 * (size_t)input_data.ncat[col] + 1)
                    workspace.buffer_szt.resize((size_t)2 * (size_t)input_data.ncat[col] + 1);
                xsd = expected_sd_cat<size_t, ldouble_safe>(
                                      workspace.ix_arr.data(), workspace.st, workspace.end,
                                      input_data.categ_data + col * input_data.nrows,
                                      input_data.ncat[col],
                                      model_params.missing_action,
                                      workspace.buffer_szt.data(),
                                      workspace.buffer_szt.data() + input_data.ncat[col] + 1,
                                      workspace.buffer_dbl.data());
            }

            else if (!workspace.weights_arr.empty())
            {
                if (workspace.buffer_dbl.size() < (size_t)2 * (size_t)input_data.ncat[col] + 1)
                    workspace.buffer_dbl.resize((size_t)2 * (size_t)input_data.ncat[col] + 1);
                xsd = expected_sd_cat_weighted<decltype(workspace.weights_arr), size_t, ldouble_safe>(
                                               workspace.ix_arr.data(), workspace.st, workspace.end,
                                               input_data.categ_data + col * input_data.nrows,
                                               input_data.ncat[col],
                                               model_params.missing_action, workspace.weights_arr,
                                               workspace.buffer_dbl.data(),
                                               workspace.buffer_szt.data(),
                                               workspace.buffer_dbl.data() + input_data.ncat[col] + 1);
            }

            else
            {
                if (workspace.buffer_dbl.size() < (size_t)2 * (size_t)input_data.ncat[col] + 1)
                    workspace.buffer_dbl.resize((size_t)2 * (size_t)input_data.ncat[col] + 1);
                xsd = expected_sd_cat_weighted<decltype(workspace.weights_map), size_t, ldouble_safe>(
                                               workspace.ix_arr.data(), workspace.st, workspace.end,
                                               input_data.categ_data + col * input_data.nrows,
                                               input_data.ncat[col],
                                               model_params.missing_action, workspace.weights_map,
                                               workspace.buffer_dbl.data(),
                                               workspace.buffer_szt.data(),
                                               workspace.buffer_dbl.data() + input_data.ncat[col] + 1);
            }
        }

        if (xsd)
        {
            variances[workspace.col_chosen] = square(xsd);
            if (workspace.tree_kurtoses != NULL)
                variances[workspace.col_chosen] *= workspace.tree_kurtoses[workspace.col_chosen];
            else if (input_data.col_weights != NULL)
                variances[workspace.col_chosen] *= input_data.col_weights[workspace.col_chosen];
            variances[workspace.col_chosen] = std::fmax(variances[workspace.col_chosen], 1e-100);
        }

        else
        {
            workspace.col_sampler.drop_col(workspace.col_chosen);
            variances[workspace.col_chosen] = 0;
        }
    }
}